

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

nodes_slot __thiscall
libtorrent::anon_unknown_62::write_nodes
          (anon_unknown_62 *this,stack_allocator *alloc,
          vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *nodes)

{
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *this_00;
  bool bVar1;
  undefined8 extraout_RDX;
  nodes_slot nVar2;
  string local_e8;
  string local_b8;
  basic_endpoint<boost::asio::ip::udp> *local_98;
  endpoint *endp;
  pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *n_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *__range2_1;
  char *local_68;
  char *v6_ptr;
  char *local_58;
  char *v4_ptr;
  allocation_slot v6_nodes_idx;
  allocation_slot v4_nodes_idx;
  pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *__range2;
  int v6_num_nodes;
  int v4_num_nodes;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *nodes_local;
  stack_allocator *alloc_local;
  
  __range2._4_4_ = 0;
  __range2._0_4_ = 0;
  _v6_num_nodes = nodes;
  nodes_local = (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                 *)alloc;
  alloc_local = (stack_allocator *)this;
  __end2 = std::
           vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           ::begin(nodes);
  n = (pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *)
      std::
      vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
      ::end(nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
                                *)&n);
    if (!bVar1) break;
    _v6_nodes_idx =
         __gnu_cxx::
         __normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
         ::operator*(&__end2);
    bVar1 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(&_v6_nodes_idx->second);
    if (bVar1) {
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    else {
      __range2._0_4_ = (int)__range2 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
    ::operator++(&__end2);
  }
  v4_ptr._4_4_ = libtorrent::aux::stack_allocator::allocate
                           ((stack_allocator *)nodes_local,__range2._4_4_ * 0x1a);
  v4_ptr._0_4_ = libtorrent::aux::stack_allocator::allocate
                           ((stack_allocator *)nodes_local,(int)__range2 * 0x26);
  v6_ptr._4_4_ = v4_ptr._4_4_;
  local_58 = libtorrent::aux::stack_allocator::ptr((stack_allocator *)nodes_local,v4_ptr._4_4_);
  local_68 = libtorrent::aux::stack_allocator::ptr((stack_allocator *)nodes_local,v4_ptr._0_4_);
  this_00 = _v6_num_nodes;
  __end2_1 = std::
             vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
             ::begin(_v6_num_nodes);
  n_1 = (pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *)
        std::
        vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
                        *)&n_1);
    if (!bVar1) break;
    endp = (endpoint *)
           __gnu_cxx::
           __normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
           ::operator*(&__end2_1);
    local_98 = &((reference)endp)->second;
    bVar1 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(local_98);
    if (bVar1) {
      digest32<160l>::to_string_abi_cxx11_(&local_b8,endp);
      detail::write_string(&local_b8,&local_58);
      std::__cxx11::string::~string((string *)&local_b8);
      detail::write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
                (local_98,&local_58);
    }
    else {
      digest32<160l>::to_string_abi_cxx11_(&local_e8,endp);
      detail::write_string(&local_e8,&local_68);
      std::__cxx11::string::~string((string *)&local_e8);
      detail::write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
                (local_98,&local_68);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_*,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>_>
    ::operator++(&__end2_1);
  }
  std::tuple<int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>::
  tuple<int_&,_const_libtorrent::aux::allocation_slot_&,_int_&,_const_libtorrent::aux::allocation_slot_&,_true,_true>
            ((tuple<int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot> *)
             this,(int *)((long)&__range2 + 4),(allocation_slot *)((long)&v4_ptr + 4),
             (int *)&__range2,(allocation_slot *)&v4_ptr);
  nVar2.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Head_base<1UL,_libtorrent::aux::allocation_slot,_false>._M_head_impl.m_idx =
       (allocation_slot)(allocation_slot)(int)extraout_RDX;
  nVar2.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Head_base<0UL,_int,_false>._M_head_impl = (int)((ulong)extraout_RDX >> 0x20);
  nVar2.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot> =
       (_Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot>)this;
  return (nodes_slot)
         nVar2.
         super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  ;
}

Assistant:

nodes_slot write_nodes(aux::stack_allocator& alloc
		, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes)
	{
		int v4_num_nodes = 0;
		int v6_num_nodes = 0;

		for (auto const& n : nodes)
		{
			if (is_v4(n.second))
				v4_num_nodes++;
			else
				v6_num_nodes++;
		}

		aux::allocation_slot const v4_nodes_idx = alloc.allocate(v4_num_nodes * (20 + 6));
		aux::allocation_slot const v6_nodes_idx = alloc.allocate(v6_num_nodes * (20 + 18));

		char* v4_ptr = alloc.ptr(v4_nodes_idx);
		char* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (auto const& n : nodes)
		{
			udp::endpoint const& endp = n.second;
			if (is_v4(endp))
			{
				detail::write_string(n.first.to_string(), v4_ptr);
				detail::write_endpoint(endp, v4_ptr);
			}
			else
			{
				detail::write_string(n.first.to_string(), v6_ptr);
				detail::write_endpoint(endp, v6_ptr);
			}
		}

		return nodes_slot{v4_num_nodes, v4_nodes_idx, v6_num_nodes, v6_nodes_idx};
	}